

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O1

void __thiscall QColumnViewPrivate::updateScrollbars(QColumnViewPrivate *this)

{
  long *plVar1;
  long lVar2;
  QAbstractItemView **ppQVar3;
  QWidgetData *pQVar4;
  QScrollBar *pQVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  
  plVar1 = *(long **)&(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                      super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  iVar6 = QAbstractAnimation::state();
  if (iVar6 == 2) {
    return;
  }
  lVar2 = (this->columns).d.size;
  if (lVar2 == 0) {
    iVar6 = 0;
  }
  else {
    iVar7 = QWidget::x((QWidget *)(this->columns).d.ptr[lVar2 + -1]);
    ppQVar3 = (this->columns).d.ptr;
    pQVar4 = (ppQVar3[(this->columns).d.size + -1]->super_QAbstractScrollArea).super_QFrame.
             super_QWidget.data;
    iVar6 = (pQVar4->crect).x1.m_i;
    iVar9 = (pQVar4->crect).x2.m_i;
    iVar8 = QWidget::x((QWidget *)*ppQVar3);
    iVar6 = ((iVar7 + iVar9) - (iVar8 + iVar6)) + 1;
    if (iVar6 < 1) {
      iVar7 = QWidget::x((QWidget *)*(this->columns).d.ptr);
      ppQVar3 = (this->columns).d.ptr;
      pQVar4 = ((*ppQVar3)->super_QAbstractScrollArea).super_QFrame.super_QWidget.data;
      iVar6 = (pQVar4->crect).x1.m_i;
      iVar9 = (pQVar4->crect).x2.m_i;
      iVar8 = QWidget::x((QWidget *)ppQVar3[(this->columns).d.size + -1]);
      iVar6 = ((iVar7 + iVar9) - (iVar8 + iVar6)) + 1;
    }
  }
  pQVar4 = ((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.viewport)->data;
  iVar9 = ((pQVar4->crect).x2.m_i - (pQVar4->crect).x1.m_i) + 1;
  if ((iVar6 < iVar9) &&
     (iVar7 = QAbstractSlider::value
                        (&((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                          hbar)->super_QAbstractSlider), iVar7 == 0)) {
    iVar6 = 0;
  }
  else {
    iVar8 = (**(code **)(*plVar1 + 0x2b0))(plVar1);
    iVar7 = iVar8 + iVar6;
    if (iVar9 <= iVar8 + iVar6) {
      iVar7 = iVar9;
    }
    iVar6 = iVar6 - iVar7;
    iVar9 = QAbstractSlider::maximum
                      (&((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                        hbar)->super_QAbstractSlider);
    if (iVar6 == iVar9) goto LAB_0056c141;
  }
  QAbstractSlider::setRange
            (&((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.hbar)->
              super_QAbstractSlider,0,iVar6);
LAB_0056c141:
  if ((this->columns).d.size != 0) {
    pQVar4 = ((*(this->columns).d.ptr)->super_QAbstractScrollArea).super_QFrame.super_QWidget.data;
    iVar9 = ((pQVar4->crect).x2.m_i - (pQVar4->crect).x1.m_i) + 1;
    iVar6 = QAbstractSlider::pageStep
                      (&((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                        hbar)->super_QAbstractSlider);
    if (iVar9 != iVar6) {
      QAbstractSlider::setPageStep
                (&((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.hbar)->
                  super_QAbstractSlider,iVar9);
    }
  }
  iVar6 = QAbstractSlider::maximum
                    (&((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.hbar)
                      ->super_QAbstractSlider);
  pQVar5 = (this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.hbar;
  if (0 < iVar6 ==
      (bool)-(*(char *)((long)&((pQVar5->super_QAbstractSlider).super_QWidget.data)->
                               widget_attributes + 1) >> 7)) {
    return;
  }
  (**(code **)(*(long *)&(pQVar5->super_QAbstractSlider).super_QWidget + 0x68))(pQVar5,0 < iVar6);
  return;
}

Assistant:

void QColumnViewPrivate::updateScrollbars()
{
    Q_Q(QColumnView);
#if QT_CONFIG(animation)
    if (currentAnimation.state() == QPropertyAnimation::Running)
        return;
#endif // animation

    // find the total horizontal length of the laid out columns
    int horizontalLength = 0;
    if (!columns.isEmpty()) {
        horizontalLength = (columns.constLast()->x() + columns.constLast()->width()) - columns.constFirst()->x();
        if (horizontalLength <= 0) // reverse mode
            horizontalLength = (columns.constFirst()->x() + columns.constFirst()->width()) - columns.constLast()->x();
    }

    QSize viewportSize = viewport->size();
    if (horizontalLength < viewportSize.width() && hbar->value() == 0) {
        hbar->setRange(0, 0);
    } else {
        int visibleLength = qMin(horizontalLength + q->horizontalOffset(), viewportSize.width());
        int hiddenLength = horizontalLength - visibleLength;
        if (hiddenLength != hbar->maximum())
            hbar->setRange(0, hiddenLength);
    }
    if (!columns.isEmpty()) {
        int pageStepSize = columns.at(0)->width();
        if (pageStepSize != hbar->pageStep())
            hbar->setPageStep(pageStepSize);
    }
    bool visible = (hbar->maximum() > 0);
    if (visible != hbar->isVisible())
        hbar->setVisible(visible);
}